

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

uintwide_t<256U,_unsigned_int,_void,_true> * __thiscall
math::wide_integer::uintwide_t<256U,_unsigned_int,_void,_true>::operator/=
          (uintwide_t<256U,_unsigned_int,_void,_true> *this,
          uintwide_t<256U,_unsigned_int,_void,_true> *other)

{
  bool bVar1;
  bool bVar2;
  reference puVar3;
  iterator puVar4;
  uint *first;
  undefined1 local_7c [8];
  local_unsigned_wide_type b;
  local_unsigned_wide_type a;
  bool denom_was_neg;
  bool numer_was_neg;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  uintwide_t<256U,_unsigned_int,_void,_true> *other_local;
  uintwide_t<256U,_unsigned_int,_void,_true> *this_local;
  
  if (this == other) {
    puVar3 = detail::array_detail::array<unsigned_int,_8UL>::front((array<unsigned_int,_8UL> *)this)
    ;
    *puVar3 = 1;
    puVar4 = detail::array_detail::array<unsigned_int,_8UL>::begin((array<unsigned_int,_8UL> *)this)
    ;
    first = detail::advance_and_point<unsigned_int*,unsigned_int>(puVar4,1);
    puVar4 = detail::array_detail::array<unsigned_int,_8UL>::end((array<unsigned_int,_8UL> *)this);
    detail::fill_unsafe<unsigned_int*,unsigned_int>(first,puVar4,0);
  }
  else {
    bVar1 = is_zero(other);
    if (bVar1) {
      limits_helper_max<true>();
      *(undefined8 *)(this->values).super_array<unsigned_int,_8UL>.elems = stack0xffffffffffffffc8;
      *(undefined8 *)((this->values).super_array<unsigned_int,_8UL>.elems + 2) = local_30;
      *(undefined8 *)((this->values).super_array<unsigned_int,_8UL>.elems + 4) = local_28;
      *(undefined8 *)((this->values).super_array<unsigned_int,_8UL>.elems + 6) = local_20;
    }
    else {
      bVar1 = is_neg<true>(this,(enable_if_t<true,_int> *)0x0);
      bVar2 = is_neg<true>(other,(enable_if_t<true,_int> *)0x0);
      if ((bVar1) || (bVar2)) {
        uintwide_t<256U,_unsigned_int,_void,_false>::uintwide_t<true,_nullptr>
                  ((uintwide_t<256U,_unsigned_int,_void,_false> *)
                   (b.values.super_array<unsigned_int,_8UL>.elems + 6),this);
        uintwide_t<256U,_unsigned_int,_void,_false>::uintwide_t<true,_nullptr>
                  ((uintwide_t<256U,_unsigned_int,_void,_false> *)local_7c,other);
        if (bVar1) {
          uintwide_t<256U,_unsigned_int,_void,_false>::negate
                    ((uintwide_t<256U,_unsigned_int,_void,_false> *)
                     (b.values.super_array<unsigned_int,_8UL>.elems + 6));
        }
        if (bVar2) {
          uintwide_t<256U,_unsigned_int,_void,_false>::negate
                    ((uintwide_t<256U,_unsigned_int,_void,_false> *)local_7c);
        }
        uintwide_t<256U,_unsigned_int,_void,_false>::eval_divide_knuth
                  ((uintwide_t<256U,_unsigned_int,_void,_false> *)
                   (b.values.super_array<unsigned_int,_8UL>.elems + 6),
                   (uintwide_t<256U,_unsigned_int,_void,_false> *)local_7c,
                   (uintwide_t<256U,_unsigned_int,_void,_false> *)0x0);
        if (bVar1 != bVar2) {
          uintwide_t<256U,_unsigned_int,_void,_false>::negate
                    ((uintwide_t<256U,_unsigned_int,_void,_false> *)
                     (b.values.super_array<unsigned_int,_8UL>.elems + 6));
        }
        *(undefined8 *)(this->values).super_array<unsigned_int,_8UL>.elems =
             b.values.super_array<unsigned_int,_8UL>.elems._24_8_;
        *(undefined8 *)((this->values).super_array<unsigned_int,_8UL>.elems + 2) =
             a.values.super_array<unsigned_int,_8UL>.elems._0_8_;
        *(undefined8 *)((this->values).super_array<unsigned_int,_8UL>.elems + 4) =
             a.values.super_array<unsigned_int,_8UL>.elems._8_8_;
        *(undefined8 *)((this->values).super_array<unsigned_int,_8UL>.elems + 6) =
             a.values.super_array<unsigned_int,_8UL>.elems._16_8_;
      }
      else {
        eval_divide_knuth(this,other,(uintwide_t<256U,_unsigned_int,_void,_true> *)0x0);
      }
    }
  }
  return this;
}

Assistant:

constexpr auto operator/=(const uintwide_t& other) -> uintwide_t&
    {
      if(this == &other)
      {
        values.front() = static_cast<limb_type>(UINT8_C(1));

        detail::fill_unsafe(detail::advance_and_point(values.begin(), 1U), values.end(), static_cast<limb_type>(UINT8_C(0))); // LCOV_EXCL_LINE
      }
      else if(other.is_zero())
      {
        static_cast<void>(operator=(limits_helper_max<IsSigned>()));
      }
      else
      {
        // Unary division function.

        const auto numer_was_neg = is_neg(*this);
        const auto denom_was_neg = is_neg(other);

        if(numer_was_neg || denom_was_neg)
        {
          using local_unsigned_wide_type = uintwide_t<Width2, limb_type, AllocatorType, false>;

          local_unsigned_wide_type a(*this);
          local_unsigned_wide_type b(other);

          if(numer_was_neg) { a.negate(); }
          if(denom_was_neg) { b.negate(); }

          a.eval_divide_knuth(b);

          if(numer_was_neg != denom_was_neg) { a.negate(); }

          values = a.values;
        }
        else
        {
          eval_divide_knuth(other);
        }
      }

      return *this;
    }